

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O3

uchar ON_Font::WindowsLogfontCharSetFromFaceName(wchar_t *face_name)

{
  bool bVar1;
  
  if ((face_name != (wchar_t *)0x0) && (L' ' < *face_name)) {
    bVar1 = ON_wString::EqualOrdinal(L"CityBlueprint",-1,face_name,-1,true);
    if (bVar1) {
      return '\x02';
    }
    bVar1 = ON_wString::EqualOrdinal(L"CountryBlueprint",-1,face_name,-1,true);
    if (bVar1) {
      return '\x02';
    }
  }
  return '\x01';
}

Assistant:

unsigned char ON_Font::WindowsLogfontCharSetFromFaceName(
  const wchar_t* face_name
  )
{
  unsigned char logfont_charset = ON_Font::WindowsConstants::logfont_default_charset;


  if( nullptr != face_name && face_name[0] > ON_wString::Space )
  {
    // Problem fonts
    if (ON_wString::EqualOrdinal(L"CityBlueprint", -1, face_name, -1, true))
      return ON_Font::WindowsConstants::logfont_symbol_charset;

    if (ON_wString::EqualOrdinal(L"CountryBlueprint", -1, face_name, -1, true))
      return ON_Font::WindowsConstants::logfont_symbol_charset;

#if defined(ON_OS_WINDOWS_GDI)
    HDC font_hdc = ON_Font::CreateWindowsLogfontDeviceContext();
    if(nullptr != font_hdc)
    {
      // See if there is a font with this facename that has the symbol charset 
      LOGFONT logfont;
      memset(&logfont, 0, sizeof(logfont));
      for(int i = 0; i < LF_FACESIZE && face_name[i]; i++)
        logfont.lfFaceName[i] = face_name[i];

      // Dale lear - set logfont.lfOutPrecision May 2017
      logfont.lfOutPrecision = ON_Font::WindowsConstants::logfont_out_precis;

      // Is it a SYMBOL_CHARSET font?
      logfont.lfCharSet = ON_Font::WindowsConstants::logfont_symbol_charset;
      if (7 == ::EnumFontFamiliesEx(font_hdc, &logfont, (FONTENUMPROC)ON__IsSymbolCharSetFontFaceNameHelper, 0, 0))
      {
        // Yes, this facename is a "symbol font"
        logfont_charset = ON_Font::WindowsConstants::logfont_symbol_charset;
      }
      ON_Font::DeleteWindowsLogfontDeviceContext(font_hdc);
    }
#endif
  }

  return logfont_charset;
}